

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::fade(Image *__return_storage_ptr__,Image *_A,Image *_B,float _pct)

{
  ulong uVar1;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  int _channels;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  thread *thrd_1;
  pointer ptVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long *local_80;
  float local_74;
  thread thrd;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  local_74 = _pct;
  iVar3 = (*_A->_vptr_Image[6])(_A);
  iVar4 = (*_A->_vptr_Image[7])(_A);
  _channels = (*_A->_vptr_Image[8])(_A);
  Image::Image(__return_storage_ptr__,iVar3,iVar4,_channels);
  iVar3 = (*_A->_vptr_Image[6])(_A);
  iVar4 = (*_B->_vptr_Image[6])(_B);
  if (iVar3 == iVar4) {
    iVar3 = (*_A->_vptr_Image[7])(_A);
    iVar4 = (*_B->_vptr_Image[7])(_B);
    if (iVar3 == iVar4) {
      iVar3 = (*_A->_vptr_Image[8])(_A);
      iVar4 = (*_B->_vptr_Image[8])(_B);
      if (iVar3 == iVar4) {
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar5 = std::thread::hardware_concurrency();
        iVar3 = (*_A->_vptr_Image[7])(_A);
        iVar4 = (*_A->_vptr_Image[7])(_A);
        uVar11 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar11 = 0;
        }
        uVar10 = 0;
        for (uVar9 = 0;
            ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start, uVar11 != uVar9; uVar9 = uVar9 + 1) {
          thrd._M_id._M_thread = (id)0;
          local_80 = (long *)operator_new(0x38);
          lVar7 = 0;
          if (uVar5 - 1 == uVar9) {
            lVar7 = (long)(iVar4 % (int)uVar5);
          }
          uVar1 = (long)(iVar3 / (int)uVar5) + uVar10;
          *local_80 = (long)&PTR___State_003de450;
          local_80[1] = (long)__return_storage_ptr__;
          local_80[2] = (long)_A;
          local_80[3] = (long)_B;
          local_80[4] = uVar10;
          local_80[5] = lVar7 + uVar1;
          *(float *)(local_80 + 6) = local_74;
          std::thread::_M_start_thread(&thrd,&local_80,0);
          if (local_80 != (long *)0x0) {
            (**(code **)(*local_80 + 8))();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                    (&threads,&thrd);
          std::thread::~thread(&thrd);
          uVar10 = uVar1;
        }
        for (; ptVar8 != ptVar2; ptVar8 = ptVar8 + 1) {
          std::thread::join();
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
        return __return_storage_ptr__;
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Images can\'t be mixed because they have different sizes (");
  iVar3 = (*_A->_vptr_Image[6])(_A);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6,"x");
  iVar3 = (*_A->_vptr_Image[7])(_A);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6," vs ");
  iVar3 = (*_B->_vptr_Image[6])(_B);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6,"x");
  iVar3 = (*_B->_vptr_Image[7])(_B);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  return __return_storage_ptr__;
}

Assistant:

Image fade(const Image& _A, const Image& _B, float _pct) {
    Image out = Image(_A.getWidth(), _A.getHeight(), _A.getChannels());

    if (_A.getWidth() != _B.getWidth() || _A.getHeight() != _B.getHeight() || _A.getChannels() != _B.getChannels()) {
        std::cout << "Images can't be mixed because they have different sizes (" << _A.getWidth() << "x" << _A.getHeight() << " vs " << _B.getWidth() << "x" << _B.getHeight() << ")" << std::endl;
        return out;
    }

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t pixelsPerThread = _A.getHeight() / nThreads;
    size_t pixelsLeftOver = _A.getHeight() % nThreads;
    for (int t = 0; t < nThreads; ++t) {
        size_t start = t * pixelsPerThread;
        size_t end = start + pixelsPerThread;
        if (t == nThreads - 1)
            end = start + pixelsPerThread + pixelsLeftOver;

        std::thread thrd( 
            [&out, &_A, &_B, start, end, _pct]() {
                for (size_t y = start; y < end; y++)
                for (size_t x = 0; x < _A.getWidth(); x++) {
                    size_t i = _A.getIndex(x, y);
                    out.setColor(i, glm::mix(_A.getColor(i), _B.getColor(i), _pct));
                }
            }
        );
        threads.push_back(std::move(thrd));
    }
    for (std::thread& thrd : threads)
        thrd.join();

    return out;
}